

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

string * __thiscall
cmFortranParser_s::ModName(string *__return_storage_ptr__,cmFortranParser_s *this,string *mod_name)

{
  string *mod_name_local;
  cmFortranParser_s *this_local;
  
  std::operator+(__return_storage_ptr__,mod_name,".mod");
  return __return_storage_ptr__;
}

Assistant:

std::string cmFortranParser_s::ModName(std::string const& mod_name) const
{
  return mod_name + ".mod";
}